

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O1

void test_msg_insert_body(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  nng_msg *local_20;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc(&local_20,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x3d,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_msg_append(local_20,"xyz",4);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0x3e,"%s: expected success, got %s (%d)",
                           "nng_msg_append(msg, \"xyz\", 4)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_msg_insert(local_20,"uvw",3);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x3f,"%s: expected success, got %s (%d)",
                             "nng_msg_insert(msg, \"uvw\", 3)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_msg_insert(local_20,"st",2);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x40,"%s: expected success, got %s (%d)",
                               "nng_msg_insert(msg, \"st\", 2)",pcVar3,nVar1);
        if (iVar2 != 0) {
          sVar4 = nng_msg_len(local_20);
          iVar2 = acutest_check_((uint)(sVar4 == 9),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x41,"%s","nng_msg_len(msg) == 9");
          if (iVar2 != 0) {
            pcVar3 = (char *)nng_msg_body(local_20);
            iVar2 = strcmp(pcVar3,"stuvwxyz");
            iVar2 = acutest_check_((uint)(iVar2 == 0),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0x42,"%s","strcmp(nng_msg_body(msg), \"stuvwxyz\") == 0");
            if (iVar2 != 0) {
              nng_msg_free(local_20);
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_insert_body(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_msg_append(msg, "xyz", 4));
	NUTS_PASS(nng_msg_insert(msg, "uvw", 3));
	NUTS_PASS(nng_msg_insert(msg, "st", 2));
	NUTS_ASSERT(nng_msg_len(msg) == 9);
	NUTS_ASSERT(strcmp(nng_msg_body(msg), "stuvwxyz") == 0);
	nng_msg_free(msg);
}